

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

ecs_entity_t
assign_ptr_w_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component,size_t size,
                   void *ptr,_Bool is_move,_Bool notify)

{
  ecs_table_t *table;
  ecs_world_t *world_00;
  _Bool _Var1;
  ecs_size_t eVar2;
  ecs_stage_t *stage;
  void *__s;
  ecs_entity_t eVar3;
  ecs_c_info_t *peVar4;
  undefined7 in_register_00000089;
  ecs_move_t p_Var5;
  ecs_entities_t added;
  ecs_entity_info_t info;
  ecs_world_t *local_88;
  ecs_entity_t local_80;
  ecs_entity_t local_78;
  undefined4 local_6c;
  ecs_entities_t local_68;
  ecs_entity_info_t local_58;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000089,is_move);
  local_88 = world;
  local_80 = component;
  local_78 = entity;
  stage = ecs_get_stage(&local_88);
  local_68.count = 1;
  local_68.array = &local_80;
  if (entity == 0) {
    entity = ecs_new_id(local_88);
    local_78 = entity;
    if (stage->scope != 0) {
      local_38 = stage->scope | 0xfd00000000000000;
      local_58.record = (ecs_record_t *)&local_38;
      local_58.table._0_4_ = 1;
      add_entities(local_88,entity,(ecs_entities_t *)&local_58);
    }
  }
  eVar3 = local_80;
  world_00 = local_88;
  eVar2 = ecs_from_size_t(size);
  _Var1 = ecs_defer_set(world_00,stage,EcsOpSet,entity,eVar3,eVar2,ptr,(void **)0x0,(_Bool *)0x0);
  if (_Var1) {
    return entity;
  }
  __s = get_mutable(local_88,entity,local_80,&local_58,(_Bool *)0x0);
  _ecs_assert(__s != (void *)0x0,0xc,(char *)0x0,"dst != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x87a);
  if (__s == (void *)0x0) {
    __assert_fail("dst != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x87a,
                  "ecs_entity_t assign_ptr_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t, size_t, void *, _Bool, _Bool)"
                 );
  }
  if (ptr == (void *)0x0) {
    memset(__s,0,size);
  }
  else {
    eVar3 = ecs_get_typeid(local_88,local_80);
    peVar4 = get_c_info(local_88,eVar3);
    if (peVar4 != (ecs_c_info_t *)0x0) {
      if ((char)local_6c == '\0') {
        p_Var5 = (peVar4->lifecycle).copy;
      }
      else {
        p_Var5 = (peVar4->lifecycle).move;
      }
      if (p_Var5 != (ecs_move_t)0x0) {
        (*p_Var5)(local_88,eVar3,&local_78,&local_78,__s,ptr,size,1,(peVar4->lifecycle).ctx);
        goto LAB_00111ab9;
      }
    }
    eVar2 = ecs_from_size_t(size);
    memcpy(__s,ptr,(long)eVar2);
  }
LAB_00111ab9:
  table = (ecs_table_t *)CONCAT44(local_58.table._4_4_,local_58.table._0_4_);
  ecs_table_mark_dirty(table,local_80);
  if (notify) {
    ecs_run_set_systems(local_88,&local_68,table,local_58.data,local_58.row,1,false);
  }
  ecs_defer_flush(local_88,stage);
  return local_78;
}

Assistant:

static
ecs_entity_t assign_ptr_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component,
    size_t size,
    void * ptr,
    bool is_move,
    bool notify)
{
    ecs_stage_t *stage = ecs_get_stage(&world);

    ecs_entities_t added = {
        .array = &component,
        .count = 1
    };

    if (!entity) {
        entity = ecs_new_id(world);
        ecs_entity_t scope = stage->scope;
        if (scope) {
            ecs_add_entity(world, entity, ECS_CHILDOF | scope);
        }
    }

    if (ecs_defer_set(world, stage, EcsOpSet, entity, component, 
        ecs_from_size_t(size), ptr, NULL, NULL))
    {
        return entity;
    }

    ecs_entity_info_t info;

    void *dst = get_mutable(world, entity, component, &info, NULL);

    /* This can no longer happen since we defer operations */
    ecs_assert(dst != NULL, ECS_INTERNAL_ERROR, NULL);

    if (ptr) {
        ecs_entity_t real_id = ecs_get_typeid(world, component);
        ecs_c_info_t *cdata = get_c_info(world, real_id);
        if (cdata) {
            if (is_move) {
                ecs_move_t move = cdata->lifecycle.move;
                if (move) {
                    move(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            } else {
                ecs_copy_t copy = cdata->lifecycle.copy;
                if (copy) {
                    copy(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            }
        } else {
            ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
        }
    } else {
        memset(dst, 0, size);
    }

    ecs_table_mark_dirty(info.table, component);

    if (notify) {
        ecs_run_set_systems(world, &added, 
            info.table, info.data, info.row, 1, false);
    }

    ecs_defer_flush(world, stage);

    return entity;
}